

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

char * __thiscall HV_Edit_Buffer::add(HV_Edit_Buffer *this,char *text,int size)

{
  size_t sVar1;
  int local_24;
  int size_local;
  char *text_local;
  HV_Edit_Buffer *this_local;
  
  local_24 = size;
  if (size < 0) {
    sVar1 = strlen(text);
    local_24 = (int)sVar1;
  }
  this_local = (HV_Edit_Buffer *)text;
  if (local_24 != 0) {
    check(this,local_24);
    memcpy(this->buf_ + this->size_,text,(long)local_24);
    this->size_ = local_24 + this->size_;
    this->buf_[this->size_] = '\0';
    this_local = (HV_Edit_Buffer *)(text + local_24);
  }
  return (char *)this_local;
}

Assistant:

const char *HV_Edit_Buffer::add(const char *text, int size) {

  if (size < 0) size = (int)strlen(text);
  if (!size) return text;

  check(size);

#if (DEBUG_EDIT_BUFFER > 1)
  printf("HV_Edit_Buffer::add(text,%d), allocated=%d, size=%d\n",
	 size, allocated_, size_+size);
  fflush(stdout);
#endif

  memcpy(buf_+size_, text, size);
  size_ += size;
  buf_[size_] = '\0';

  return (text + size);

}